

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O3

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,1ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::AbsId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,AbsConstraint *c,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::AbsId>_>
          *prepro)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  initializer_list<double> __l;
  initializer_list<int> __l_00;
  VarOrConst VVar6;
  allocator_type local_202;
  allocator_type local_201;
  vector<int,_std::allocator<int>_> local_200;
  vector<double,_std::allocator<double>_> local_1e8;
  int local_1cc;
  undefined1 *local_1c8;
  AffineExpr local_1c0;
  LinTerms local_140;
  LinearFunctionalConstraint local_c8;
  
  iVar1 = (c->super_CustomConstraintData<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::AbsId>).
          args_._M_elems[0];
  lVar2 = (long)iVar1;
  dVar5 = *(double *)(*(long *)(this + 0x40) + lVar2 * 8);
  if (0.0 <= dVar5) {
    prepro->result_var_ = iVar1;
  }
  else {
    dVar4 = *(double *)(*(long *)(this + 0x58) + lVar2 * 8);
    if (dVar4 <= 0.0) {
      local_1c8 = &DAT_bff0000000000000;
      __l._M_len = 1;
      __l._M_array = (iterator)&local_1c8;
      std::vector<double,_std::allocator<double>_>::vector(&local_1e8,__l,&local_201);
      __l_00._M_len = 1;
      __l_00._M_array = &local_1cc;
      local_1cc = iVar1;
      std::vector<int,_std::allocator<int>_>::vector(&local_200,__l_00,&local_202);
      LinTerms::LinTerms(&local_140,&local_1e8,&local_200);
      if (local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
          super_small_vector_data_base<double_*,_unsigned_long>.m_capacity < 7) {
        local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_1c0.super_LinTerms.coefs_.
                   super_small_vector_base<std::allocator<double>,_6U>.m_data.m_storage;
        local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        if (local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
            super_small_vector_data_base<double_*,_unsigned_long>.m_size != 0) {
          memcpy(local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>
                 .m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                 local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                 super_small_vector_data_base<double_*,_unsigned_long>.m_size * 8);
        }
      }
      else {
        local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr;
        local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity =
             local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
             super_small_vector_data_base<double_*,_unsigned_long>.m_capacity;
        local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity = 6;
        local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_size = 0;
        local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                   m_storage;
      }
      if (local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
          super_small_vector_data_base<int_*,_unsigned_long>.m_capacity < 7) {
        local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                   m_data.m_storage;
        local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        if (local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
            super_small_vector_data_base<int_*,_unsigned_long>.m_size != 0) {
          memcpy(local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.
                 m_data.super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                 local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                 super_small_vector_data_base<int_*,_unsigned_long>.m_size * 4);
        }
      }
      else {
        local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr;
        local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity =
             local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
             super_small_vector_data_base<int_*,_unsigned_long>.m_capacity;
        local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity = 6;
        local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_size = 0;
        local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr =
             (ptr)&local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.m_storage
        ;
      }
      local_1c0.constant_term_ = 0.0;
      LinearFunctionalConstraint::LinearFunctionalConstraint(&local_c8,&local_1c0);
      VVar6 = FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
              ::AssignResult2Args<mp::LinearFunctionalConstraint>
                        ((FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
                          *)this,&local_c8);
      if (6 < local_c8.affine_expr_.super_LinTerms.vars_.
              super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_c8.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_c8.affine_expr_.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_c8.affine_expr_.super_LinTerms.coefs_.
              super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_c8.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_c8.affine_expr_.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus._M_p !=
          &local_c8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2) {
        operator_delete(local_c8.super_FunctionalConstraint.super_BasicConstraint.name_._M_dataplus.
                        _M_p,local_c8.super_FunctionalConstraint.super_BasicConstraint.name_.field_2
                             ._M_allocated_capacity + 1);
      }
      if (6 < local_1c0.super_LinTerms.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data
              .super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1c0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_1c0.super_LinTerms.vars_.
                        super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_1c0.super_LinTerms.coefs_.super_small_vector_base<std::allocator<double>,_6U>.
              m_data.super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_1c0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_1c0.super_LinTerms.coefs_.
                        super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (6 < local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
              super_small_vector_data_base<int_*,_unsigned_long>.m_capacity) {
        operator_delete(local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_data_ptr,
                        local_140.vars_.super_small_vector_base<std::allocator<int>,_6U>.m_data.
                        super_small_vector_data_base<int_*,_unsigned_long>.m_capacity << 2);
      }
      if (6 < local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
              super_small_vector_data_base<double_*,_unsigned_long>.m_capacity) {
        operator_delete(local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_data_ptr,
                        local_140.coefs_.super_small_vector_base<std::allocator<double>,_6U>.m_data.
                        super_small_vector_data_base<double_*,_unsigned_long>.m_capacity << 3);
      }
      if (local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_200.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      prepro->result_var_ = VVar6.field_1._0_4_;
    }
    else {
      dVar5 = -dVar5;
      if (dVar4 <= dVar5) {
        dVar4 = dVar5;
      }
      uVar3 = -(ulong)(dVar4 < prepro->ub_);
      prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
      prepro->ub_ = (double)(~uVar3 & (ulong)prepro->ub_ | (ulong)dVar4 & uVar3);
      prepro->type_ = *(Type *)(*(long *)(this + 0xa0) + lVar2 * 4);
    }
  }
  return;
}

Assistant:

void PreprocessConstraint(
      AbsConstraint& c, PreprocessInfo& prepro) {
    const auto argvar = c.GetArguments()[0];
    const auto lb = MPD( lb(argvar) ),
        ub = MPD( ub(argvar) );
    if (lb>=0.0) {  // When result var is set, \a c is skipped
      prepro.set_result_var(argvar);
      return;
    } else if (ub<=0.0) {
      auto res = MPD( AssignResult2Args(   // create newvar = -argvar
            LinearFunctionalConstraint({ {{-1.0}, {argvar}}, 0.0 })) );
      prepro.set_result_var(res.get_var());
      return;
    }
    prepro.narrow_result_bounds(0.0, std::max(-lb, ub));
    prepro.set_result_type( MPD( var_type(argvar) ) );
  }